

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule_abi_cxx11_
          (string *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this)

{
  TargetType targetType;
  cmGeneratorTarget *pcVar1;
  char *__rhs;
  string *name;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmNinjaNormalTargetGenerator *local_18;
  cmNinjaNormalTargetGenerator *this_local;
  
  local_18 = this;
  this_local = (cmNinjaNormalTargetGenerator *)__return_storage_ptr__;
  std::operator+(&local_78,&this->TargetLinkLanguage,"_");
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  targetType = cmGeneratorTarget::GetType(pcVar1);
  __rhs = cmState::GetTargetTypeName(targetType);
  std::operator+(&local_58,&local_78,__rhs);
  std::operator+(&local_38,&local_58,"_DEVICE_LINKER__");
  pcVar1 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  name = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
  cmGlobalNinjaGenerator::EncodeRuleName(&local_a8,name);
  std::operator+(__return_storage_ptr__,&local_38,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaNormalTargetGenerator::LanguageLinkerDeviceRule() const
{
  return this->TargetLinkLanguage + "_" +
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType()) +
    "_DEVICE_LINKER__" +
    cmGlobalNinjaGenerator::EncodeRuleName(
           this->GetGeneratorTarget()->GetName());
}